

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

uint32_t helper_get_r13_banked_aarch64(CPUARMState_conflict *env,uint32_t mode)

{
  uint uVar1;
  uint32_t target_el;
  uint32_t *puVar2;
  
  uVar1 = env->uncached_cpsr & 0x1f;
  if (uVar1 != 0x1f) {
    if (uVar1 == mode) {
      puVar2 = env->regs + 0xd;
    }
    else {
      uVar1 = bank_number(mode);
      puVar2 = env->banked_r13 + uVar1;
    }
    return *puVar2;
  }
  target_el = exception_target_el(env);
  raise_exception_aarch64(env,1,0x2000000,target_el);
}

Assistant:

uint32_t HELPER(get_r13_banked)(CPUARMState *env, uint32_t mode)
{
    if ((env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_SYS) {
        /* SRS instruction is UNPREDICTABLE from System mode; we UNDEF.
         * Other UNPREDICTABLE and UNDEF cases were caught at translate time.
         */
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }

    if ((env->uncached_cpsr & CPSR_M) == mode) {
        return env->regs[13];
    } else {
        return env->banked_r13[bank_number(mode)];
    }
}